

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O2

void __thiscall
so_5::impl::local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::
local_mbox_template<>
          (local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> *this,
          mbox_id_t id)

{
  _Rb_tree_header *p_Var1;
  
  abstract_message_box_t::abstract_message_box_t(&this->super_abstract_message_box_t);
  (this->super_data_t).m_id = id;
  (this->super_data_t).m_lock.m_counters.super___atomic_base<unsigned_long>._M_i = 0;
  p_Var1 = &(this->super_data_t).m_subscribers._M_t._M_impl.super__Rb_tree_header;
  (this->super_data_t).m_subscribers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->super_data_t).m_subscribers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_data_t).m_subscribers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_data_t).m_subscribers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_data_t).m_subscribers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_abstract_message_box_t)._vptr_abstract_message_box_t =
       (_func_int **)&PTR__local_mbox_template_002c7c10;
  return;
}

Assistant:

local_mbox_template(
			//! ID of this mbox.
			mbox_id_t id,
			//! Optional parameters for TRACING_BASE's constructor.
			TRACING_ARGS &&... args )
			:	local_mbox_details::data_t{ id }
			,	TRACING_BASE{ std::forward< TRACING_ARGS >(args)... }
			{}